

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O3

bool __thiscall
glcts::ShaderBitfieldOperationCaseBinaryInt::test
          (ShaderBitfieldOperationCaseBinaryInt *this,Data *data)

{
  GLint GVar1;
  long lVar2;
  GLint expected2;
  GLint local_2c;
  
  if (0 < this->m_components) {
    lVar2 = 0;
    do {
      local_2c = 0;
      GVar1 = (*this->m_func)(data->inIvec4[lVar2],data->in2Ivec4[lVar2],&local_2c);
      if ((data->outIvec4[lVar2] != GVar1) || (data->out2Ivec4[lVar2] != local_2c)) {
        return false;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < this->m_components);
  }
  return true;
}

Assistant:

virtual bool test(Data const* data)
	{
		for (int i = 0; i < m_components; ++i)
		{
			GLint expected2 = 0;
			GLint expected  = m_func(data->inIvec4[i], data->in2Ivec4[i], expected2);
			if (data->outIvec4[i] != expected || data->out2Ivec4[i] != expected2)
			{
				return false;
			}
		}
		return true;
	}